

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_gzip_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_gzip_ratio_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  u_char *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = *(uint *)v;
  *(uint *)v = (uVar6 & 0x8fffffff) + 0x10000000;
  pvVar1 = r->ctx[ngx_http_gzip_filter_module.ctx_index];
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x80) == 0)) {
    uVar6 = uVar6 & 0x8fffffff | 0x50000000;
  }
  else {
    puVar4 = (u_char *)ngx_pnalloc(r->pool,0xe);
    v->data = puVar4;
    if (puVar4 == (u_char *)0x0) {
      return -1;
    }
    uVar2 = *(ulong *)((long)pvVar1 + 0x78);
    uVar3 = *(ulong *)((long)pvVar1 + 0x80);
    uVar5 = uVar2 / uVar3;
    uVar8 = ((uVar2 * 100) / uVar3) % 100;
    uVar7 = uVar8;
    if (4 < (uint)(((uVar2 * 1000) / uVar3) % 10)) {
      uVar5 = (uVar5 + 1) - (ulong)(uVar8 < 99);
      uVar7 = 0;
      if (uVar8 < 99) {
        uVar7 = uVar8 + 1;
      }
    }
    puVar4 = ngx_sprintf(puVar4,"%ui.%02ui",uVar5,uVar7);
    uVar6 = *(uint *)v & 0xf0000000 | (int)puVar4 - *(int *)&v->data & 0xfffffffU;
  }
  *(uint *)v = uVar6;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_gzip_ratio_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_uint_t            zint, zfrac;
    ngx_http_gzip_ctx_t  *ctx;

    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    ctx = ngx_http_get_module_ctx(r, ngx_http_gzip_filter_module);

    if (ctx == NULL || ctx->zout == 0) {
        v->not_found = 1;
        return NGX_OK;
    }

    v->data = ngx_pnalloc(r->pool, NGX_INT32_LEN + 3);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    zint = (ngx_uint_t) (ctx->zin / ctx->zout);
    zfrac = (ngx_uint_t) ((ctx->zin * 100 / ctx->zout) % 100);

    if ((ctx->zin * 1000 / ctx->zout) % 10 > 4) {

        /* the rounding, e.g., 2.125 to 2.13 */

        zfrac++;

        if (zfrac > 99) {
            zint++;
            zfrac = 0;
        }
    }

    v->len = ngx_sprintf(v->data, "%ui.%02ui", zint, zfrac) - v->data;

    return NGX_OK;
}